

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlIsRef(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  _xmlDtd *p_Var1;
  xmlHashTablePtr hash;
  void *pvVar2;
  xmlChar *key2;
  
  if (attr == (xmlAttrPtr)0x0) {
    return 0;
  }
  if ((doc == (xmlDocPtr)0x0) && (doc = attr->doc, doc == (_xmlDoc *)0x0)) {
    return 0;
  }
  p_Var1 = doc->intSubset;
  if ((p_Var1 == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    return 0;
  }
  if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  if (doc->type != XML_HTML_DOCUMENT_NODE) {
    if (attr->ns == (xmlNs *)0x0) {
      key2 = (xmlChar *)0x0;
    }
    else {
      key2 = attr->ns->prefix;
    }
    if (((p_Var1 == (_xmlDtd *)0x0) || ((xmlHashTablePtr)p_Var1->attributes == (xmlHashTablePtr)0x0)
        ) || (pvVar2 = xmlHashLookup3((xmlHashTablePtr)p_Var1->attributes,attr->name,key2,elem->name
                                     ), pvVar2 == (void *)0x0)) {
      if (doc->extSubset == (_xmlDtd *)0x0) {
        return 0;
      }
      hash = (xmlHashTablePtr)doc->extSubset->attributes;
      if (hash == (xmlHashTablePtr)0x0) {
        return 0;
      }
      pvVar2 = xmlHashLookup3(hash,attr->name,key2,elem->name);
      if (pvVar2 == (void *)0x0) {
        return 0;
      }
    }
    return (uint)(*(int *)((long)pvVar2 + 0x50) - 3U < 2);
  }
  return 0;
}

Assistant:

int
xmlIsRef(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if (attr == NULL)
        return(0);
    if (doc == NULL) {
        doc = attr->doc;
	if (doc == NULL) return(0);
    }

    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        /* TODO @@@ */
        return(0);
    } else {
        xmlAttributePtr attrDecl;
        const xmlChar *aprefix;

        if (elem == NULL) return(0);
        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name, attr->name,
                                      aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name, attr->name,
                                          aprefix);

	if ((attrDecl != NULL) &&
	    (attrDecl->atype == XML_ATTRIBUTE_IDREF ||
	     attrDecl->atype == XML_ATTRIBUTE_IDREFS))
	return(1);
    }
    return(0);
}